

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O3

void UpdateMConcatNode(Col_Word node)

{
  Col_Word CVar1;
  Col_Word CVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  byte *pbVar10;
  undefined2 uVar11;
  byte *pbVar12;
  byte *pbVar13;
  Col_Word left2;
  Col_Word right;
  Col_Word left;
  byte *local_78;
  byte *local_60;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  local_78 = *(byte **)(node + 0x10);
  local_50 = local_78;
  bVar3 = GetDepth((Col_Word)local_78);
  pbVar12 = *(byte **)(node + 0x18);
  local_58 = pbVar12;
  bVar4 = GetDepth((Col_Word)pbVar12);
  pbVar10 = (byte *)node;
  if ((((ulong)pbVar12 & 0xf) != 0) &&
     (pbVar10 = (byte *)node, (0x11000100U >> ((uint)pbVar12 & 0x1f) & 1) != 0)) {
LAB_00110ac4:
    bVar5 = *(byte *)node;
    sVar8 = Col_ListLength((Col_Word)local_78);
    if (bVar4 < bVar3) {
      bVar4 = bVar3;
    }
    *(byte *)node = 0x26;
    *(byte *)(node + 1) = bVar4 + 1;
    sVar9 = Col_ListLength((Col_Word)pbVar12);
    uVar11 = (undefined2)sVar8;
    if (0xffff < sVar8) {
      uVar11 = 0;
    }
    *(size_t *)(node + 8) = sVar9 + sVar8;
    *(undefined2 *)(node + 2) = uVar11;
    *(byte **)(node + 0x10) = local_78;
    *(byte **)(node + 0x18) = pbVar12;
    if ((bVar5 & 1) != 0) {
      *(byte *)node = *(byte *)node | 1;
    }
    return;
  }
  do {
    local_48 = pbVar10;
    if (bVar4 + 1 < (uint)bVar3) {
      if (local_78 == (byte *)0x0) {
LAB_00110664:
        ConvertToMConcatNode((Col_Word *)&local_50);
        local_78 = local_50;
      }
      else {
        if (((ulong)local_78 & 0xf) == 0) {
          if ((*local_78 & 2) == 0) goto LAB_00110664;
          uVar7 = *local_78 & 0xfffffffe;
        }
        else {
          uVar7 = immediateWordTypes[(uint)local_78 & 0x1f];
        }
        if (uVar7 != 0x26) goto LAB_00110664;
      }
      pbVar10 = *(byte **)(local_78 + 0x10);
      bVar3 = GetDepth((Col_Word)pbVar10);
      pbVar13 = *(byte **)(local_78 + 0x18);
      local_60 = pbVar13;
      bVar5 = GetDepth((Col_Word)pbVar13);
      if (bVar3 < bVar5) {
        local_38 = pbVar12;
        if (pbVar13 == (byte *)0x0) {
LAB_00110848:
          ConvertToMConcatNode((Col_Word *)&local_60);
          pbVar13 = local_60;
        }
        else {
          if (((ulong)pbVar13 & 0xf) == 0) {
            if ((*pbVar13 & 2) == 0) goto LAB_00110848;
            uVar7 = *pbVar13 & 0xfffffffe;
          }
          else {
            uVar7 = immediateWordTypes[(uint)pbVar13 & 0x1f];
          }
          if (uVar7 != 0x26) goto LAB_00110848;
        }
        CVar1 = *(Col_Word *)(pbVar13 + 0x10);
        CVar2 = *(Col_Word *)(pbVar13 + 0x18);
        bVar5 = GetDepth(CVar2);
        bVar6 = GetDepth(CVar1);
        sVar8 = Col_ListLength((Col_Word)pbVar10);
        if (bVar3 <= bVar6) {
          bVar3 = bVar6;
        }
        bVar3 = bVar3 + 1;
        *local_78 = 0x26;
        local_78[1] = bVar3;
        local_40 = pbVar10;
        sVar9 = Col_ListLength(CVar1);
        uVar11 = (undefined2)sVar8;
        if (0xffff < sVar8) {
          uVar11 = 0;
        }
        *(size_t *)(local_78 + 8) = sVar9 + sVar8;
        *(undefined2 *)(local_78 + 2) = uVar11;
        *(byte **)(local_78 + 0x10) = local_40;
        *(Col_Word *)(local_78 + 0x18) = CVar1;
        sVar8 = Col_ListLength(CVar2);
        pbVar12 = local_38;
        if (bVar4 < bVar5) {
          bVar4 = bVar5;
        }
        bVar4 = bVar4 + 1;
        *pbVar13 = 0x26;
        pbVar13[1] = bVar4;
        sVar9 = Col_ListLength((Col_Word)local_38);
        *(size_t *)(pbVar13 + 8) = sVar9 + sVar8;
        uVar11 = (undefined2)sVar8;
        if (0xffff < sVar8) {
          uVar11 = 0;
        }
        *(undefined2 *)(pbVar13 + 2) = uVar11;
        *(Col_Word *)(pbVar13 + 0x10) = CVar2;
        *(byte **)(pbVar13 + 0x18) = pbVar12;
        pbVar10 = local_78;
        local_78 = pbVar13;
        local_58 = pbVar13;
      }
      else {
        sVar8 = Col_ListLength((Col_Word)pbVar13);
        bVar5 = GetDepth((Col_Word)pbVar13);
        if (bVar4 < bVar5) {
          bVar4 = bVar5;
        }
        bVar4 = bVar4 + 1;
        *local_78 = 0x26;
        local_78[1] = bVar4;
        sVar9 = Col_ListLength((Col_Word)pbVar12);
        *(size_t *)(local_78 + 8) = sVar9 + sVar8;
        uVar11 = (undefined2)sVar8;
        if (0xffff < sVar8) {
          uVar11 = 0;
        }
        *(undefined2 *)(local_78 + 2) = uVar11;
        *(byte **)(local_78 + 0x10) = pbVar13;
        *(byte **)(local_78 + 0x18) = pbVar12;
        local_58 = local_78;
        local_50 = pbVar10;
      }
    }
    else {
      node = (Col_Word)local_48;
      if ((uint)bVar4 <= bVar3 + 1) goto LAB_00110ac4;
      if (pbVar12 == (byte *)0x0) {
LAB_00110754:
        ConvertToMConcatNode((Col_Word *)&local_58);
        pbVar12 = local_58;
      }
      else {
        if (((ulong)pbVar12 & 0xf) == 0) {
          if ((*pbVar12 & 2) == 0) goto LAB_00110754;
          uVar7 = *pbVar12 & 0xfffffffe;
        }
        else {
          uVar7 = immediateWordTypes[(uint)pbVar12 & 0x1f];
        }
        if (uVar7 != 0x26) goto LAB_00110754;
      }
      pbVar10 = *(byte **)(pbVar12 + 0x10);
      pbVar13 = *(byte **)(pbVar12 + 0x18);
      local_60 = pbVar10;
      bVar5 = GetDepth((Col_Word)pbVar13);
      uVar7 = bVar4 - 1;
      if (uVar7 < bVar5 || uVar7 == bVar5) {
        sVar8 = Col_ListLength((Col_Word)local_78);
        bVar6 = GetDepth((Col_Word)pbVar10);
        if (bVar6 < bVar3) {
          bVar6 = bVar3;
        }
        bVar3 = bVar6 + 1;
        *pbVar12 = 0x26;
        pbVar12[1] = bVar4;
        sVar9 = Col_ListLength((Col_Word)pbVar10);
        *(size_t *)(pbVar12 + 8) = sVar9 + sVar8;
        uVar11 = (undefined2)sVar8;
        if (0xffff < sVar8) {
          uVar11 = 0;
        }
        *(undefined2 *)(pbVar12 + 2) = uVar11;
        *(byte **)(pbVar12 + 0x10) = local_78;
        *(byte **)(pbVar12 + 0x18) = pbVar10;
        pbVar10 = pbVar12;
        local_78 = pbVar13;
        bVar4 = bVar5;
        local_58 = pbVar13;
        local_50 = pbVar12;
      }
      else {
        local_40 = pbVar13;
        local_38 = pbVar12;
        if (pbVar10 == (byte *)0x0) {
LAB_0011095b:
          ConvertToMConcatNode((Col_Word *)&local_60);
          pbVar10 = local_60;
        }
        else {
          if (((ulong)pbVar10 & 0xf) == 0) {
            if ((*pbVar10 & 2) == 0) goto LAB_0011095b;
            uVar7 = *pbVar10 & 0xfffffffe;
          }
          else {
            uVar7 = immediateWordTypes[(uint)pbVar10 & 0x1f];
          }
          if (uVar7 != 0x26) goto LAB_0011095b;
        }
        CVar1 = *(Col_Word *)(pbVar10 + 0x10);
        bVar4 = GetDepth(CVar1);
        CVar2 = *(Col_Word *)(pbVar10 + 0x18);
        bVar6 = GetDepth(CVar2);
        sVar8 = Col_ListLength((Col_Word)local_78);
        if (bVar4 < bVar3) {
          bVar4 = bVar3;
        }
        bVar3 = bVar4 + 1;
        *pbVar10 = 0x26;
        pbVar10[1] = bVar3;
        sVar9 = Col_ListLength(CVar1);
        *(size_t *)(pbVar10 + 8) = sVar9 + sVar8;
        uVar11 = (undefined2)sVar8;
        if (0xffff < sVar8) {
          uVar11 = 0;
        }
        *(undefined2 *)(pbVar10 + 2) = uVar11;
        *(byte **)(pbVar10 + 0x10) = local_78;
        *(Col_Word *)(pbVar10 + 0x18) = CVar1;
        local_50 = pbVar10;
        sVar8 = Col_ListLength(CVar2);
        local_78 = local_38;
        pbVar12 = local_40;
        if (bVar5 < bVar6) {
          bVar5 = bVar6;
        }
        *local_38 = 0x26;
        local_38[1] = bVar5 + 1;
        sVar9 = Col_ListLength((Col_Word)local_40);
        *(size_t *)(local_78 + 8) = sVar9 + sVar8;
        uVar11 = (undefined2)sVar8;
        if (0xffff < sVar8) {
          uVar11 = 0;
        }
        *(undefined2 *)(local_78 + 2) = uVar11;
        *(Col_Word *)(local_78 + 0x10) = CVar2;
        *(byte **)(local_78 + 0x18) = pbVar12;
        bVar4 = bVar5 + 1;
      }
    }
    pbVar12 = local_48;
    sVar8 = Col_ListLength((Col_Word)pbVar10);
    bVar5 = bVar4;
    if (bVar4 < bVar3) {
      bVar5 = bVar3;
    }
    *pbVar12 = 0x26;
    pbVar12[1] = bVar5 + 1;
    sVar9 = Col_ListLength((Col_Word)local_78);
    uVar11 = (undefined2)sVar8;
    if (0xffff < sVar8) {
      uVar11 = 0;
    }
    *(size_t *)(pbVar12 + 8) = sVar9 + sVar8;
    *(undefined2 *)(pbVar12 + 2) = uVar11;
    *(byte **)(pbVar12 + 0x10) = pbVar10;
    *(byte **)(pbVar12 + 0x18) = local_78;
    pbVar12 = local_78;
    local_78 = pbVar10;
    pbVar10 = local_48;
  } while( true );
}

Assistant:

static void
UpdateMConcatNode(
    Col_Word node)  /*!< Mutable concat list node. */
{
    Col_Word left, right;
    unsigned char leftDepth, rightDepth;
    size_t leftLength;
    int pinned;

    ASSERT(WORD_TYPE(node) == WORD_TYPE_MCONCATLIST);

    left = WORD_CONCATLIST_LEFT(node);
    leftDepth = GetDepth(left);
    right = WORD_CONCATLIST_RIGHT(node);
    rightDepth = GetDepth(right);

    if (WORD_TYPE(right) != WORD_TYPE_CIRCLIST) {
        /*
         * Balance tree.
         */

        for (;;) {
            if (leftDepth > rightDepth+1) {
                /*
                 * Left is deeper by more than 1 level, rebalance.
                 */

                unsigned char left1Depth, left2Depth;
                Col_Word left1, left2;

                ASSERT(leftDepth >= 2);
                if (WORD_TYPE(left) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&left);
                }
                ASSERT(WORD_TYPE(left) == WORD_TYPE_MCONCATLIST);

                left1 = WORD_CONCATLIST_LEFT(left);
                left1Depth = GetDepth(left1);
                left2 = WORD_CONCATLIST_RIGHT(left);
                left2Depth = GetDepth(left2);
                if (left1Depth < left2Depth) {
                    /*
                     * Left2 is deeper, split it between both arms.
                     */

                    Col_Word left21, left22;
                    unsigned char left21Depth, left22Depth;

                    if (WORD_TYPE(left2) != WORD_TYPE_MCONCATLIST) {
                        ConvertToMConcatNode(&left2);
                    }
                    ASSERT(WORD_TYPE(left2) == WORD_TYPE_MCONCATLIST);
                    ASSERT(WORD_CONCATLIST_DEPTH(left2) >= 1);

                    left21 = WORD_CONCATLIST_LEFT(left2);
                    left22 = WORD_CONCATLIST_RIGHT(left2);
                    left22Depth = GetDepth(left22);
                    left21Depth = GetDepth(left21);

                    /*
                     * Update left node.
                     */

                    leftLength = Col_ListLength(left1);
                    leftDepth = (left1Depth>left21Depth?left1Depth:left21Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left, leftDepth,
                            leftLength+Col_ListLength(left21), leftLength,
                            left1, left21);

                    /*
                     * Turn left2 into right node.
                     */

                    leftLength = Col_ListLength(left22);
                    rightDepth = (left22Depth>rightDepth?left22Depth:rightDepth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left2, rightDepth,
                        leftLength+Col_ListLength(right), leftLength, left22,
                        right);
                    right = left2;
                } else {
                    /*
                     * Left1 is deeper or at the same level, rotate to right.
                     */

                    unsigned char left2Depth;

                    ASSERT(left1Depth >= 1);

                    /*
                     * Turn left into right node.
                     */

                    leftLength = Col_ListLength(left2);
                    left2Depth = GetDepth(left2);
                    rightDepth = (left2Depth>rightDepth?left2Depth:rightDepth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left, rightDepth,
                            leftLength+Col_ListLength(right), leftLength, left2,
                            right);
                    right = left;

                    /*
                     * Turn left1 into left node.
                     */

                    left = left1;
                    leftDepth = left1Depth;
                }
            } else if (leftDepth+1 < rightDepth) {
                /*
                 * Right is deeper by more than 1 level, rebalance.
                 */

                unsigned char right2Depth;
                Col_Word right1, right2;

                ASSERT(rightDepth >= 2);
                if (WORD_TYPE(right) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&right);
                }
                ASSERT(WORD_TYPE(right) == WORD_TYPE_MCONCATLIST);

                right1 = WORD_CONCATLIST_LEFT(right);
                right2 = WORD_CONCATLIST_RIGHT(right);
                right2Depth = GetDepth(right2);
                if (right2Depth < rightDepth-1) {
                    /*
                     * Right1 is deeper, split it between both arms.
                     */

                    Col_Word right11, right12;
                    unsigned char right11Depth, right12Depth;

                    if (WORD_TYPE(right1) != WORD_TYPE_MCONCATLIST) {
                        ConvertToMConcatNode(&right1);
                    }
                    ASSERT(WORD_TYPE(right1) == WORD_TYPE_MCONCATLIST);
                    ASSERT(WORD_CONCATLIST_DEPTH(right1) >= 1);

                    right11 = WORD_CONCATLIST_LEFT(right1);
                    right11Depth = GetDepth(right11);
                    right12 = WORD_CONCATLIST_RIGHT(right1);
                    right12Depth = GetDepth(right12);

                    /*
                     * Turn right1 into left node.
                     */

                    leftLength = Col_ListLength(left);
                    leftDepth = (leftDepth>right11Depth?leftDepth:right11Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right1, leftDepth,
                            leftLength+Col_ListLength(right11), leftLength,
                            left, right11);
                    left = right1;

                    /*
                     * Update right node.
                     */

                    leftLength = Col_ListLength(right12);
                    rightDepth = (right12Depth>right2Depth?right12Depth:right2Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right, rightDepth,
                            leftLength+Col_ListLength(right2), leftLength,
                            right12, right2);
                } else {
                    /*
                     * Right2 is deeper or at the same level, rotate to left.
                     */

                    unsigned char right1Depth;

                    ASSERT(right2Depth >= 1);

                    /*
                     * Turn right into left node.
                     */

                    leftLength = Col_ListLength(left);
                    right1Depth = GetDepth(right1);
                    leftDepth = (leftDepth>right1Depth?leftDepth:right1Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right, rightDepth,
                            leftLength+Col_ListLength(right1), leftLength, left,
                            right1);
                    left = right;

                    /*
                     * Turn right2 into right node.
                     */

                    right = right2;
                    rightDepth = right2Depth;
                }
            } else {
                /*
                 * Tree is balanced, stop there.
                 */

                break;
            }

            /*
             * Update node.
             */

            leftLength = Col_ListLength(left);
            WORD_MCONCATLIST_INIT(node,
                    (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
                    leftLength+Col_ListLength(right), leftLength, left, right);
        }
    }

    /*
     * Update node.
     */

    pinned = WORD_PINNED(node);
    leftLength = Col_ListLength(left);
    WORD_MCONCATLIST_INIT(node,
            (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
            leftLength+Col_ListLength(right), leftLength, left, right);
    if (pinned) {
        WORD_SET_PINNED(node);
    }
}